

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.hpp
# Opt level: O1

int __thiscall front::symbol::ArraySymbol::getLen(ArraySymbol *this)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  if (this->_size == -1) {
    getSize(this);
  }
  iVar1 = this->_size;
  peVar3 = (this->_item).super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  this_00 = (this->_item).super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  iVar2 = *(int *)&peVar3[1]._name._M_dataplus._M_p;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return iVar1 / iVar2;
}

Assistant:

int getLen() {
    if (_size == -1) {
      getSize();
    }

    return _size / static_pointer_cast<IntSymbol>(_item)->getSize();
  }